

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O2

void ur_kpss(double *y,int N,char *type,int lshort,int *klag,double *statistic,double *pval)

{
  size_t __size;
  int iVar1;
  double *__ptr;
  double *res;
  double *csum;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dStack_a8;
  double tablep [4];
  double ylo;
  double yhi;
  double *local_70;
  int *local_68;
  reg_object local_60;
  int local_54;
  double *local_50;
  double *local_48;
  double *local_40;
  int local_34;
  
  tablep[1] = 0.05;
  tablep[2] = 0.1;
  dStack_a8 = 0.01;
  tablep[0] = 0.025;
  __size = (long)N * 8;
  local_70 = statistic;
  local_68 = klag;
  local_54 = lshort;
  local_48 = (double *)type;
  local_40 = y;
  __ptr = (double *)malloc(__size);
  res = (double *)malloc(__size);
  local_50 = (double *)malloc(0x20);
  csum = (double *)malloc(__size);
  pdVar5 = local_48;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < N) {
    uVar4 = (ulong)(uint)N;
  }
  while (uVar4 != uVar3) {
    __ptr[uVar3] = (double)(int)(uVar3 + 1);
    uVar3 = uVar3 + 1;
  }
  local_34 = N;
  iVar1 = strcmp((char *)local_48,"trend");
  if (iVar1 == 0) {
    *local_50 = 0.216;
    local_50[1] = 0.176;
    local_50[2] = 0.146;
    local_50[3] = 0.119;
    pdVar2 = (double *)malloc(0x20);
    local_60 = reg_init(local_34,2);
    pdVar5 = __ptr;
  }
  else {
    iVar1 = strcmp((char *)pdVar5,"level");
    if (iVar1 != 0) {
      puts("kpss only accepts two types - level and trend. ");
      exit(-1);
    }
    *local_50 = 0.739;
    local_50[1] = 0.574;
    local_50[2] = 0.463;
    local_50[3] = 0.347;
    pdVar2 = (double *)malloc(8);
    local_60 = reg_init(local_34,1);
    pdVar5 = (double *)0x0;
  }
  local_48 = pdVar2;
  regress(local_60,pdVar5,local_40,res,pdVar2,0.95);
  cumsum(res,local_34,csum);
  dVar7 = 0.0;
  dVar8 = 0.0;
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    dVar8 = dVar8 + csum[uVar3] * csum[uVar3];
    dVar7 = dVar7 + res[uVar3] * res[uVar3];
  }
  local_40 = (double *)(dVar8 / (double)(local_34 * local_34));
  yhi = dVar7 / (double)local_34;
  bVar6 = local_54 == 1;
  dVar7 = pow((double)local_34 / 100.0,0.25);
  iVar1 = local_34;
  local_34 = (int)(dVar7 * *(double *)(&DAT_00155d48 + (ulong)bVar6 * 8));
  if ((local_68 != (int *)0x0) && (0 < *local_68)) {
    local_34 = *local_68;
  }
  ppsum(res,iVar1,local_34,&yhi);
  pdVar2 = local_50;
  pdVar5 = local_70;
  *local_70 = (double)local_40 / yhi;
  arrayminmax(local_50,4,tablep + 3,&ylo);
  dVar7 = interpolate_linear(pdVar2,&dStack_a8,4,*pdVar5);
  *pval = dVar7;
  if (local_68 != (int *)0x0) {
    *local_68 = local_34;
  }
  free(local_50);
  free(__ptr);
  free(res);
  free(csum);
  free(local_48);
  free_reg(local_60);
  return;
}

Assistant:

void ur_kpss(double *y, int N,const char* type,int lshort, int *klag, double *statistic,double *pval) {
    /*
    y - Time Series data of length N
    type - "level" or "trend"
    lshort - determines the length of lag used. lshort = 1 => lag = 4.0 * pow(((double) N)/100.0,0.25)
    else lag = 12.0 * pow(((double) N)/100.0,0.25). It can be bypassed by parameter klag
    klag - Length of the lag. Set it to > 0 instead of NULL if you wnat it to bypass lshort. Set it to NULL or negative otherwise

    Outputs

    statistic - Test statistic
    pval - p-value used to determine null hypothesis

    */
    int i,p,l;
    double *tt,*res,*table,*varcovar,*csum;
    double alpha,eta,s2,ylo,yhi;
    reg_object fit;

    double tablep[4] = {0.01, 0.025, 0.05, 0.10};

    tt = (double*)malloc(sizeof(double)*N);
    res = (double*)malloc(sizeof(double)*N);
    table = (double*)malloc(sizeof(double)*4);
    csum = (double*)malloc(sizeof(double)*N);

    for(i = 1; i <= N;++i) {
        tt[i-1] = (double) i;
    }

    alpha = 0.95;

    if (!strcmp(type,"trend")) {
            table[0] = 0.216; table[1] = 0.176; table[2] = 0.146; table[3] = 0.119;
            p = 2;
            varcovar = (double*)malloc(sizeof(double)*p*p);

            fit = reg_init(N,p);
            regress(fit,tt,y,res,varcovar,alpha);

        } else if (!strcmp(type,"level")) {
            table[0] = 0.739; table[1] = 0.574; table[2] = 0.463; table[3] = 0.347;
            p = 1;
            varcovar = (double*)malloc(sizeof(double)*p*p);

            fit = reg_init(N,p);
            regress(fit,NULL,y,res,varcovar,alpha);
    } else {
        printf("kpss only accepts two types - level and trend. \n");
        exit(-1);
    }

    cumsum(res,N,csum);

    eta = s2 = 0.0;

    for(i = 0; i < N;++i) {
        eta += (csum[i] * csum[i]);
        s2 += (res[i] * res[i]);
    }

    eta /= (double) (N*N);
    s2 /= (double) N;

    if (lshort == 1) {
        l = (int) 4.0 * pow(((double) N)/100.0,0.25);
    } else {
        l = (int) 12.0 * pow(((double) N)/100.0,0.25);
    }

    if (klag != NULL && *klag > 0) {
        l = *klag;
    }

    ppsum(res,N,l,&s2);

    *statistic = eta/s2;

    arrayminmax(table,4,&ylo,&yhi);

    *pval = interpolate_linear(table,tablep,4,*statistic);

    if (klag != NULL) *klag = l;

    free(table);
    free(tt);
    free(res);
    free(csum);
    free(varcovar);
    free_reg(fit);
}